

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrf.c
# Opt level: O2

void zgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int iVar2;
  int_t *piVar3;
  int_t *piVar4;
  double dVar5;
  int iVar6;
  int_t iVar7;
  int_t iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int_t *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  int nseg;
  uint local_18c;
  ulong local_188;
  int *local_180;
  int *repfnz;
  int *segrep;
  fact_t local_164;
  uint local_160;
  int nseg1;
  ulong local_158;
  int_t *xprune;
  superlu_options_t *local_148;
  int *local_140;
  int *local_138;
  doublecomplex *dense;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_108;
  ulong local_100;
  int_t *local_f8;
  doublecomplex *tempv;
  int_t *xplore;
  int_t *local_e0;
  long local_d8;
  int_t *local_d0;
  int_t *local_c8;
  int *local_c0;
  int *local_b8;
  SuperMatrix *local_b0;
  int *local_a8;
  int_t *local_a0;
  double local_98;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  long local_70;
  int_t *local_68;
  flops_t *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_188 = CONCAT44(local_188._4_4_,relax);
  local_180 = etree;
  iVar6 = sp_ienv(6);
  local_164 = options->Fact;
  local_98 = options->DiagPivotThresh;
  local_a8 = stat->panel_histo;
  local_60 = stat->ops;
  uVar9 = A->nrow;
  local_158 = (ulong)uVar9;
  local_18c = A->ncol;
  local_160 = local_18c;
  if ((int)uVar9 < (int)local_18c) {
    local_160 = uVar9;
  }
  piVar12 = (int_t *)A->Store;
  local_38 = *(long *)(piVar12 + 2);
  piVar3 = *(int_t **)(piVar12 + 4);
  local_a0 = *(int_t **)(piVar12 + 6);
  piVar4 = *(int_t **)(piVar12 + 8);
  local_108 = (ulong)(uint)panel_size;
  local_b0 = A;
  iVar7 = zLUMemInit(local_164,work,lwork,uVar9,local_18c,*piVar12,panel_size,(double)iVar6,L,U,Glu,
                     &iwork,&zwork);
  uVar15 = local_158;
  *info = iVar7;
  if (iVar7 == 0) {
    local_b8 = Glu->xsup;
    local_c0 = Glu->supno;
    local_c8 = Glu->xlsub;
    local_d0 = Glu->xlusup;
    local_f8 = Glu->xusub;
    iVar16 = (int)local_158;
    iVar6 = (int)local_108;
    local_148 = options;
    SetIWork(iVar16,local_18c,iVar6,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,
             &marker);
    zSetRWork(iVar16,iVar6,zwork,&dense,&tempv);
    uVar18 = 0;
    usepr = (int)(local_164 == SamePattern_SameRowPerm);
    if (local_164 == SamePattern_SameRowPerm) {
      local_138 = int32Malloc(iVar16);
      uVar11 = 0;
      if (0 < iVar16) {
        uVar11 = uVar15 & 0xffffffff;
      }
      for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
        local_138[perm_r[uVar14]] = (int)uVar14;
      }
    }
    else {
      local_138 = (int *)0x0;
    }
    uVar9 = local_18c;
    local_d8 = (long)iVar16;
    local_70 = (long)(int)local_18c;
    local_140 = int32Malloc(local_18c);
    uVar11 = 0;
    if (0 < (int)uVar9) {
      uVar11 = (ulong)uVar9;
    }
    for (; uVar11 != uVar18; uVar18 = uVar18 + 1) {
      local_140[perm_c[uVar18]] = (int)uVar18;
    }
    piVar12 = intMalloc(uVar9);
    if (local_148->SymmetricMode == YES) {
      heap_relax_snode(uVar9,local_180,(int)local_188,marker,piVar12);
    }
    else {
      relax_snode(uVar9,local_180,(int)local_188,marker,piVar12);
    }
    ifill(perm_r,iVar16,-1);
    ifill(marker,iVar16 * 3,-1);
    *local_c0 = -1;
    *local_d0 = 0;
    *local_f8 = 0;
    *local_c8 = 0;
    *local_b8 = 0;
    local_68 = piVar12 + 1;
    local_50 = local_d8 * 4;
    local_58 = local_d8 << 4;
    local_188 = 0;
    uVar18 = 0;
    local_e0 = piVar12;
    while (piVar12 = local_e0, uVar9 = local_160, iVar6 = (int)uVar18, iVar6 < (int)local_160) {
      local_180 = (int *)(uVar18 & 0xffffffff);
      uVar11 = (ulong)iVar6;
      iVar16 = local_e0[uVar11];
      if ((superlu_options_t *)(long)iVar16 == (superlu_options_t *)0xffffffffffffffff) {
        uVar9 = (int)local_108 + iVar6;
        if ((int)local_160 <= (int)uVar9) {
          uVar9 = local_160;
        }
        uVar15 = 0;
        do {
          if ((long)(int)uVar9 <= (long)(uVar11 + 1 + uVar15)) {
            uVar9 = (int)uVar15 + iVar6 + 1;
            uVar18 = local_108;
            goto LAB_00105c13;
          }
          uVar18 = uVar15 + 1;
          lVar13 = uVar11 + uVar15;
          uVar15 = uVar18;
        } while (local_68[lVar13] == -1);
        uVar9 = iVar6 + (int)uVar18;
LAB_00105c13:
        iVar16 = local_160 - iVar6;
        if (uVar9 != local_160) {
          iVar16 = (int)uVar18;
        }
        local_a8[iVar16] = local_a8[iVar16] + 1;
        zpanel_dfs((int)local_158,iVar16,iVar6,local_b0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz
                   ,xprune,marker,parent,xplore,Glu);
        zpanel_bmod((int)local_158,iVar16,(int)local_180,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        local_100 = (ulong)(uint)(iVar16 + (int)local_180);
        local_148 = (superlu_options_t *)(long)(iVar16 + (int)local_180);
        lVar19 = 0;
        lVar13 = 0;
        for (; uVar18 = local_100, uVar15 = local_158, (long)uVar11 < (long)local_148;
            uVar11 = uVar11 + 1) {
          nseg = nseg1;
          iVar16 = (int)uVar11;
          iVar6 = zcolumn_dfs((int)local_158,iVar16,perm_r,&nseg,(int *)((long)panel_lsub + lVar13),
                              segrep,(int *)((long)repfnz + lVar13),xprune,marker,parent,xplore,Glu)
          ;
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
          iVar6 = zcolumn_bmod(iVar16,nseg - nseg1,(doublecomplex *)((long)&dense->r + lVar19),tempv
                               ,segrep + nseg1,(int *)((long)repfnz + lVar13),(int)local_180,Glu,
                               stat);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
          iVar6 = zcopy_to_ucol(iVar16,nseg,segrep,(int *)((long)repfnz + lVar13),perm_r,
                                (doublecomplex *)((long)&dense->r + lVar19),Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
          uVar10 = zpivotL(iVar16,local_98,&usepr,perm_r,local_138,local_140,&pivrow,Glu,stat);
          *info = uVar10;
          uVar9 = (uint)local_188;
          if ((uint)local_188 == 0) {
            uVar9 = uVar10;
          }
          local_188 = local_188 & 0xffffffff;
          if (uVar10 != 0) {
            local_188 = (ulong)uVar9;
          }
          zpruneL(iVar16,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar13),xprune,Glu);
          resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar13));
          lVar13 = lVar13 + local_50;
          lVar19 = lVar19 + local_58;
        }
      }
      else {
        local_a8[(long)(iVar16 - iVar6) + 1] = local_a8[(long)(iVar16 - iVar6) + 1] + 1;
        local_148 = (superlu_options_t *)(long)iVar16;
        iVar7 = zsnode_dfs(iVar6,iVar16,piVar3,local_a0,piVar4,xprune,marker,Glu);
        *info = iVar7;
        if (iVar7 != 0) {
          return;
        }
        local_100 = CONCAT44(local_100._4_4_,local_f8[uVar11]);
        iVar7 = local_d0[uVar11];
        local_40 = (long)local_c0[uVar11];
        local_48 = (long)local_b8[local_40];
        iVar1 = local_c8[local_48 + 1];
        iVar2 = local_c8[local_48];
        nzlumax = Glu->nzlumax;
        while (nzlumax < (iVar1 - iVar2) * ((iVar16 - iVar6) + 1) + iVar7) {
          iVar8 = zLUMemXpand((int)local_180,iVar7,LUSUP,&nzlumax,Glu);
          *info = iVar8;
          if (iVar8 != 0) {
            return;
          }
        }
        while ((long)uVar11 <= (long)local_148) {
          uVar15 = uVar11 + 1;
          local_f8[uVar11 + 1] = (int_t)local_100;
          lVar13 = (long)local_a0[uVar11];
          pdVar17 = (double *)(lVar13 * 0x10 + local_38);
          for (; lVar13 < piVar4[uVar11]; lVar13 = lVar13 + 1) {
            iVar6 = piVar3[lVar13];
            dVar5 = pdVar17[1];
            dense[iVar6].r = *pdVar17;
            dense[iVar6].i = dVar5;
            pdVar17 = pdVar17 + 2;
          }
          zsnode_bmod((int)uVar11,(int)local_40,(int)local_48,dense,tempv,Glu,stat);
          uVar10 = zpivotL((int)uVar11,local_98,&usepr,perm_r,local_138,local_140,&pivrow,Glu,stat);
          *info = uVar10;
          uVar9 = (uint)local_188;
          if ((uint)local_188 == 0) {
            uVar9 = uVar10;
          }
          local_188 = local_188 & 0xffffffff;
          uVar11 = uVar15;
          if (uVar10 != 0) {
            local_188 = (ulong)uVar9;
          }
        }
        uVar18 = uVar11 & 0xffffffff;
        uVar15 = local_158;
      }
    }
    iVar6 = (int)local_188;
    *info = iVar6;
    uVar10 = iVar6 - 1;
    if (iVar6 == 0) {
      uVar10 = local_18c;
    }
    if ((int)uVar10 < (int)uVar15) {
      lVar13 = 0;
      while ((lVar13 < local_d8 && ((int)uVar10 < (int)uVar15))) {
        if (perm_r[lVar13] == -1) {
          perm_r[lVar13] = uVar10;
          uVar10 = uVar10 + 1;
        }
        lVar13 = lVar13 + 1;
      }
    }
    countnz(local_160,xprune,&nnzL,&nnzU,Glu);
    fixupL(uVar9,perm_r,Glu);
    zLUWorkFree(iwork,zwork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_164 == SamePattern_SameRowPerm) {
      piVar3 = (int_t *)L->Store;
      *piVar3 = nnzL;
      piVar3[1] = Glu->supno[local_70];
      piVar4 = Glu->xlusup;
      *(void **)(piVar3 + 2) = Glu->lusup;
      *(int_t **)(piVar3 + 4) = piVar4;
      piVar4 = Glu->xlsub;
      *(int_t **)(piVar3 + 6) = Glu->lsub;
      *(int_t **)(piVar3 + 8) = piVar4;
      piVar3 = (int_t *)U->Store;
      *piVar3 = nnzU;
      piVar4 = Glu->usub;
      *(void **)(piVar3 + 2) = Glu->ucol;
      *(int_t **)(piVar3 + 4) = piVar4;
      *(int_t **)(piVar3 + 6) = Glu->xusub;
    }
    else {
      zCreate_SuperNode_Matrix
                (L,local_b0->nrow,uVar9,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
                 Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
      zCreate_CompCol_Matrix
                (U,uVar9,uVar9,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z,
                 SLU_TRU);
    }
    local_60[7] = local_60[0x13] + local_60[0x14] + local_60[7];
    iVar6 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar6;
    stat->expansions = iVar6;
    if (local_164 == SamePattern_SameRowPerm) {
      superlu_free(local_138);
    }
    superlu_free(local_140);
    superlu_free(piVar12);
  }
  return;
}

Assistant:

void
zgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    doublecomplex    *zwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    doublecomplex    *dense, *tempv;
    int       *relax_end;
    doublecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    zSetRWork(m, panel_size, zwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = zpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = zcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	zpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (doublecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_Z, SLU_TRLU);
    	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_Z, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}